

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

bool __thiscall
QToolBarAreaLayoutInfo::insertGap(QToolBarAreaLayoutInfo *this,QList<int> *path,QLayoutItem *item)

{
  uint uVar1;
  Orientation OVar2;
  QSize QVar3;
  Representation RVar4;
  long lVar5;
  bool bVar6;
  pointer pQVar7;
  pointer pQVar8;
  QSize QVar9;
  int newSize;
  long lVar10;
  int iVar11;
  long lVar12;
  long in_FS_OFFSET;
  QToolBarAreaLayoutLine local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar12 = (long)*(path->d).ptr;
  if ((this->lines).d.size == lVar12) {
    local_68.rect.x1.m_i = 0;
    local_68.rect.y1.m_i = 0;
    local_68.rect.x2.m_i = -1;
    local_68.rect.y2.m_i = -1;
    local_68.o = this->o;
    local_68.toolBarItems.d.d = (Data *)0x0;
    local_68.toolBarItems.d.ptr = (QToolBarAreaLayoutItem *)0x0;
    local_68.toolBarItems.d.size = 0;
    QList<QToolBarAreaLayoutLine>::emplaceBack<QToolBarAreaLayoutLine>(&this->lines,&local_68);
    QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer(&local_68.toolBarItems.d);
  }
  pQVar7 = QList<QToolBarAreaLayoutLine>::data(&this->lines);
  uVar1 = (path->d).ptr[1];
  local_68.rect.x2.m_i = 0;
  local_68.rect.y2.m_i = -1;
  local_68.o = 0xffffffff;
  local_68._20_4_ = 0xaaaaaa01;
  iVar11 = uVar1 + 1;
  lVar5 = (ulong)uVar1 * 0x18;
  local_68.rect._0_8_ = item;
  do {
    lVar10 = lVar5;
    iVar11 = iVar11 + -1;
    if (iVar11 < 1) goto LAB_0046ef88;
    pQVar8 = QList<QToolBarAreaLayoutItem>::data(&pQVar7[lVar12].toolBarItems);
    bVar6 = QToolBarAreaLayoutItem::skip
                      ((QToolBarAreaLayoutItem *)((long)&pQVar8[-1].widgetItem + lVar10));
    lVar5 = lVar10 + -0x18;
  } while (bVar6);
  OVar2 = pQVar7[lVar12].o;
  QVar9 = QToolBarAreaLayoutItem::sizeHint
                    ((QToolBarAreaLayoutItem *)((long)&pQVar8[-1].widgetItem + lVar10));
  QVar3 = (QSize)((ulong)QVar9 >> 0x20);
  if (OVar2 == Horizontal) {
    QVar3 = QVar9;
  }
  RVar4 = QVar3.wd.m_i;
  iVar11 = *(int *)((long)&pQVar8[-1].size + lVar10);
  newSize = iVar11 - RVar4.m_i;
  if (newSize != 0 && RVar4.m_i <= iVar11) {
    *(undefined4 *)((long)&pQVar8[-1].preferredSize + lVar10) = 0xffffffff;
    *(int *)((long)&pQVar8[-1].size + lVar10) = RVar4.m_i;
    QToolBarAreaLayoutItem::resize((QToolBarAreaLayoutItem *)&local_68,this->o,newSize);
  }
LAB_0046ef88:
  QList<QToolBarAreaLayoutItem>::emplace<QToolBarAreaLayoutItem_const&>
            (&pQVar7[lVar12].toolBarItems,(long)(int)uVar1,(QToolBarAreaLayoutItem *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QToolBarAreaLayoutInfo::insertGap(const QList<int> &path, QLayoutItem *item)
{
    Q_ASSERT(path.size() == 2);
    int j = path.first();
    if (j == lines.size())
        lines.append(QToolBarAreaLayoutLine(o));

    QToolBarAreaLayoutLine &line = lines[j];
    const int k = path.at(1);

    QToolBarAreaLayoutItem gap_item;
    gap_item.gap = true;
    gap_item.widgetItem = item;

    //update the previous item's preferred size
    for(int p = k - 1 ; p >= 0; --p) {
        QToolBarAreaLayoutItem &previous = line.toolBarItems[p];
        if (!previous.skip()) {
            //we found the previous one
            int previousSizeHint = pick(line.o, previous.sizeHint());
            int previousExtraSpace = previous.size - previousSizeHint;

            if (previousExtraSpace > 0) {
                //in this case we reset the space
                previous.preferredSize = -1;
                previous.size = previousSizeHint;

                gap_item.resize(o, previousExtraSpace);
            }

            break;
        }
    }

    line.toolBarItems.insert(k, gap_item);
    return true;

}